

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_test_target.cc
# Opt level: O2

void __thiscall highwayhash::VectorTest<2U>::operator()(VectorTest<2U> *this,HHNotify notify)

{
  size_t i_1;
  __m128i *p;
  long lVar1;
  size_t i_2;
  long lVar2;
  size_t i;
  long lVar3;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  V<unsigned_char> v2;
  V<unsigned_char> veq;
  V<unsigned_char> v3b;
  V<unsigned_char> vor;
  V<unsigned_char> vand;
  V<unsigned_char> sub;
  V<unsigned_char> add;
  V<unsigned_char> v2c;
  V<unsigned_char> v2b;
  V<unsigned_char> vxor;
  V<unsigned_char> local_120;
  undefined4 local_110;
  undefined4 uStack_10c;
  unsigned_long local_108;
  V<unsigned_char> local_100;
  longlong local_f0;
  longlong lStack_e8;
  V<unsigned_char> local_e0;
  V<unsigned_char> local_d0;
  V<unsigned_char> local_c0;
  V<unsigned_char> local_b0;
  V<unsigned_char> local_a0;
  V<unsigned_char> local_90;
  V<unsigned_char> local_80;
  V<unsigned_char> local_70 [4];
  
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 2;
  local_120.v_[0]._2_2_ = 0x202;
  local_120.v_[0]._4_4_ = 0x2020202;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 2;
  local_120.v_[1]._2_2_ = 0x202;
  local_120.v_[1]._4_4_ = 0x2020202;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_120,'\x02',99,notify);
  local_e0.v_[1] = 0x303030303030303;
  local_e0.v_[0] = 0x303030303030303;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_e0,'\x03',0x69,notify);
  local_100.v_[0] = -1;
  local_100.v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_100,0xff,0x6d,notify);
  local_80.v_[0] = 0x202020202020202;
  local_80.v_[1] = 0x202020202020202;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_80,'\x02',0x72,notify);
  local_90.v_[0] = 0x202020202020202;
  local_90.v_[1] = 0x202020202020202;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_90,'\x02',0x77,notify);
  local_a0.v_[0] = 0x505050505050505;
  local_a0.v_[1] = 0x505050505050505;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_a0,'\x05',0x7a,notify);
  local_b0.v_[0] = 0x101010101010101;
  local_b0.v_[1] = 0x101010101010101;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_b0,'\x01',0x7d,notify);
  local_c0.v_[0] = 0x202020202020202;
  local_c0.v_[1] = 0x202020202020202;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_c0,'\x02',0x80,notify);
  local_d0.v_[0] = 0x707070707070707;
  local_d0.v_[1] = 0x707070707070707;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_d0,'\a',0x83,notify);
  local_70[0].v_[0] = 0x101010101010101;
  local_70[0].v_[1] = 0x101010101010101;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(local_70,'\x01',0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 2;
  local_120.v_[0]._4_4_ = 0x20002;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 2;
  local_120.v_[1]._4_4_ = 0x20002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbw(extraout_XMM0,0x303030303030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_e0,3,0x69,notify);
  local_100.v_[0] = -1;
  local_100.v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_100,0xffff,0x6d,notify);
  local_80.v_[0] = 0x2000200020002;
  local_80.v_[1] = 0x2000200020002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_80,2,0x72,notify);
  local_90.v_[0] = 0x2000200020002;
  local_90.v_[1] = 0x2000200020002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_90,2,0x77,notify);
  local_a0.v_[0] = 0x5000500050005;
  local_a0.v_[1] = 0x5000500050005;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_a0,5,0x7a,notify);
  local_b0.v_[0] = 0x1000100010001;
  local_b0.v_[1] = 0x1000100010001;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_b0,1,0x7d,notify);
  local_c0.v_[0] = 0x2000200020002;
  local_c0.v_[1] = 0x2000200020002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_c0,2,0x80,notify);
  local_d0.v_[0] = 0x7000700070007;
  local_d0.v_[1] = 0x7000700070007;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_d0,7,0x83,notify);
  local_70[0].v_[0] = 0x1000100010001;
  local_70[0].v_[1] = 0x1000100010001;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)local_70,1,0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 2;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbd(extraout_XMM0_00,0x3030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_e0,3,0x69,notify);
  local_100.v_[0] = -1;
  local_100.v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)&local_100,0xffffffff,0x6d,notify);
  local_80.v_[0] = 0x200000002;
  local_80.v_[1] = 0x200000002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_80,2,0x72,notify);
  local_90.v_[0] = 0x200000002;
  local_90.v_[1] = 0x200000002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_90,2,0x77,notify);
  local_a0.v_[0] = 0x500000005;
  local_a0.v_[1] = 0x500000005;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_a0,5,0x7a,notify);
  local_b0.v_[0] = 0x100000001;
  local_b0.v_[1] = 0x100000001;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_b0,1,0x7d,notify);
  local_c0.v_[0] = 0x200000002;
  local_c0.v_[1] = 0x200000002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_c0,2,0x80,notify);
  local_d0.v_[0] = 0x700000007;
  local_d0.v_[1] = 0x700000007;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_d0,7,0x83,notify);
  local_70[0].v_[0] = 0x100000001;
  local_70[0].v_[1] = 0x100000001;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)local_70,1,0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  lVar1 = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbq(extraout_XMM0_01,0x303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_e0,3,0x69,notify)
  ;
  local_100.v_[0] = -1;
  local_100.v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_100,0xffffffffffffffff,0x6d,notify);
  local_80.v_[0] = 2;
  local_80.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_80,2,0x72,notify)
  ;
  local_90.v_[0] = 2;
  local_90.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_90,2,0x77,notify)
  ;
  local_a0.v_[0] = 5;
  local_a0.v_[1] = 5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_a0,5,0x7a,notify)
  ;
  local_b0.v_[0] = 1;
  local_b0.v_[1] = 1;
  lVar2 = 1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_b0,1,0x7d,notify)
  ;
  local_c0.v_[0] = 2;
  local_c0.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_c0,2,0x80,notify)
  ;
  local_d0.v_[0] = 7;
  local_d0.v_[1] = 7;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_d0,7,0x83,notify)
  ;
  local_70[0].v_[0] = 1;
  local_70[0].v_[1] = 1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)local_70,1,0x86,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 2;
  local_120.v_[0]._4_4_ = 0x20002;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 2;
  local_120.v_[1]._4_4_ = 0x20002;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0x80;
  local_120.v_[0]._2_2_ = 0x8000;
  local_120.v_[0]._4_4_ = 0x80008000;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0x80;
  local_120.v_[1]._2_2_ = 0x8000;
  local_120.v_[1]._4_4_ = 0x80008000;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0x8000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0,0x9b,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 2;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0x8000;
  local_120.v_[0]._4_4_ = 0x80000000;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0x8000;
  local_120.v_[1]._4_4_ = 0x80000000;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)&local_120,0x80000000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,0,0x9b,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0x80000000;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0x80000000;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0x8000000000000000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0,0x9b,notify);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)local_120.v_ + lVar3) = 4;
  }
  for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)local_120.v_ + lVar3) = 5;
  }
  local_f0 = CONCAT44(local_120.v_[0]._4_4_,
                      CONCAT22(local_120.v_[0]._2_2_,
                               CONCAT11(local_120.v_[0]._1_1_,(undefined1)local_120.v_[0])));
  lStack_e8 = CONCAT44(local_120.v_[1]._4_4_,
                       CONCAT22(local_120.v_[1]._2_2_,
                                CONCAT11(local_120.v_[1]._1_1_,(undefined1)local_120.v_[1])));
  local_e0.v_[1] = lStack_e8;
  local_e0.v_[0] = local_f0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_e0,'\x04',0xaa,notify);
  local_100.v_[0] = local_f0;
  local_100.v_[1] = lStack_e8;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_100,'\x04',0xaf,notify);
  local_100.v_[0] =
       CONCAT17((undefined1)local_120.v_[1],
                CONCAT43(local_120.v_[0]._4_4_,CONCAT21(local_120.v_[0]._2_2_,local_120.v_[0]._1_1_)
                        ));
  local_100.v_[1] =
       CONCAT17((undefined1)local_110,
                CONCAT43(local_120.v_[1]._4_4_,CONCAT21(local_120.v_[1]._2_2_,local_120.v_[1]._1_1_)
                        ));
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
            ((uchar *)((long)local_100.v_ + 0xf),'\x05',0xb4,notify);
  for (; lVar2 != 0xf; lVar2 = lVar2 + 1) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
              ((uchar *)((long)local_100.v_ + lVar2),'\x04',0xb6,notify);
  }
  local_120.v_[1]._0_1_ = (undefined1)local_f0;
  local_120.v_[1]._1_1_ = (undefined1)((ulong)local_f0 >> 8);
  local_120.v_[1]._2_2_ = (undefined2)((ulong)local_f0 >> 0x10);
  local_120.v_[1]._4_4_ = (undefined4)((ulong)local_f0 >> 0x20);
  local_110._0_1_ = (undefined1)lStack_e8;
  local_110._1_1_ = (undefined1)((ulong)lStack_e8 >> 8);
  local_110._2_2_ = (undefined2)((ulong)lStack_e8 >> 0x10);
  uStack_10c = (undefined4)((ulong)lStack_e8 >> 0x20);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 1) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
              ((uchar *)((long)local_120.v_ + lVar2),'\x04',0xbd,notify);
  }
  for (lVar2 = 0x18; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>
              ((uchar *)((long)local_120.v_ + lVar2),'\x05',0xc1,notify);
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    *(undefined2 *)((long)local_120.v_ + lVar2 * 2) = 4;
  }
  for (lVar2 = 0x10; lVar2 != 0x20; lVar2 = lVar2 + 2) {
    *(undefined2 *)((long)local_120.v_ + lVar2) = 5;
  }
  local_f0 = CONCAT44(local_120.v_[0]._4_4_,
                      CONCAT22(local_120.v_[0]._2_2_,
                               CONCAT11(local_120.v_[0]._1_1_,(undefined1)local_120.v_[0])));
  lStack_e8 = CONCAT44(local_120.v_[1]._4_4_,
                       CONCAT22(local_120.v_[1]._2_2_,
                                CONCAT11(local_120.v_[1]._1_1_,(undefined1)local_120.v_[1])));
  local_e0.v_[1] = lStack_e8;
  local_e0.v_[0] = local_f0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_e0,4,0xaa,notify);
  local_100.v_[0] = local_f0;
  local_100.v_[1] = lStack_e8;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_100,4,0xaf,notify);
  local_100.v_[0] =
       CONCAT17(local_120.v_[1]._1_1_,
                CONCAT16((undefined1)local_120.v_[1],
                         CONCAT42(local_120.v_[0]._4_4_,local_120.v_[0]._2_2_)));
  local_100.v_[1] =
       CONCAT17(local_110._1_1_,
                CONCAT16((undefined1)local_110,CONCAT42(local_120.v_[1]._4_4_,local_120.v_[1]._2_2_)
                        ));
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((unsigned_short *)((long)local_100.v_ + 0xe),5,0xb4,notify);
  for (; lVar1 != 0xe; lVar1 = lVar1 + 2) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
              ((unsigned_short *)((long)local_100.v_ + lVar1),4,0xb6,notify);
  }
  local_120.v_[1]._0_1_ = (undefined1)local_f0;
  local_120.v_[1]._1_1_ = (undefined1)((ulong)local_f0 >> 8);
  local_120.v_[1]._2_2_ = (undefined2)((ulong)local_f0 >> 0x10);
  local_120.v_[1]._4_4_ = (undefined4)((ulong)local_f0 >> 0x20);
  local_110._0_1_ = (undefined1)lStack_e8;
  local_110._1_1_ = (undefined1)((ulong)lStack_e8 >> 8);
  local_110._2_2_ = (undefined2)((ulong)lStack_e8 >> 0x10);
  uStack_10c = (undefined4)((ulong)lStack_e8 >> 0x20);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 2) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
              ((unsigned_short *)((long)local_120.v_ + lVar1),4,0xbd,notify);
  }
  for (lVar1 = 0x18; lVar1 != 0x20; lVar1 = lVar1 + 2) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
              ((unsigned_short *)((long)local_120.v_ + lVar1),5,0xc1,notify);
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined4 *)((long)local_120.v_ + lVar1 * 4) = 4;
  }
  for (lVar1 = 4; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(undefined4 *)((long)local_120.v_ + lVar1 * 4) = 5;
  }
  local_f0 = CONCAT44(local_120.v_[0]._4_4_,
                      CONCAT22(local_120.v_[0]._2_2_,
                               CONCAT11(local_120.v_[0]._1_1_,(undefined1)local_120.v_[0])));
  lStack_e8 = CONCAT44(local_120.v_[1]._4_4_,
                       CONCAT22(local_120.v_[1]._2_2_,
                                CONCAT11(local_120.v_[1]._1_1_,(undefined1)local_120.v_[1])));
  local_e0.v_[1] = lStack_e8;
  local_e0.v_[0] = local_f0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_e0,4,0xaa,notify);
  local_100.v_[0] = local_f0;
  local_100.v_[1] = lStack_e8;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_100,4,0xaf,notify);
  local_100.v_[0] =
       CONCAT26(local_120.v_[1]._2_2_,
                CONCAT15(local_120.v_[1]._1_1_,
                         CONCAT14((undefined1)local_120.v_[1],local_120.v_[0]._4_4_)));
  local_100.v_[1] =
       CONCAT26(local_110._2_2_,
                CONCAT15(local_110._1_1_,CONCAT14((undefined1)local_110,local_120.v_[1]._4_4_)));
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((uint *)((long)local_100.v_ + 0xc),5,0xb4,notify);
  for (lVar1 = 4; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
              ((uint *)((long)local_100.v_ + lVar1),4,0xb6,notify);
  }
  local_120.v_[1]._0_1_ = (undefined1)local_f0;
  local_120.v_[1]._1_1_ = (undefined1)((ulong)local_f0 >> 8);
  local_120.v_[1]._2_2_ = (undefined2)((ulong)local_f0 >> 0x10);
  local_120.v_[1]._4_4_ = (undefined4)((ulong)local_f0 >> 0x20);
  local_110._0_1_ = (undefined1)lStack_e8;
  local_110._1_1_ = (undefined1)((ulong)lStack_e8 >> 8);
  local_110._2_2_ = (undefined2)((ulong)lStack_e8 >> 0x10);
  uStack_10c = (undefined4)((ulong)lStack_e8 >> 0x20);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 4) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
              ((uint *)((long)local_120.v_ + lVar1),4,0xbd,notify);
  }
  for (lVar1 = 0x18; lVar1 != 0x20; lVar1 = lVar1 + 4) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
              ((uint *)((long)local_120.v_ + lVar1),5,0xc1,notify);
  }
  local_120.v_[0]._0_1_ = 4;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_2_ = 0;
  local_120.v_[0]._4_4_ = 0;
  local_120.v_[1]._0_1_ = 4;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_2_ = 0;
  local_120.v_[1]._4_4_ = 0;
  local_110._0_1_ = 5;
  local_110._1_1_ = 0;
  local_110._2_2_ = 0;
  uStack_10c = 0;
  local_108 = 5;
  local_f0 = 4;
  lStack_e8 = 4;
  local_e0.v_[1]._0_2_ = 4;
  local_e0.v_[0] = 4;
  local_e0.v_[1]._2_6_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_e0,4,0xaa,notify)
  ;
  local_100.v_[0] = local_f0;
  local_100.v_[1] = lStack_e8;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_100,4,0xaf,notify);
  local_100.v_[0] =
       CONCAT44(local_120.v_[1]._4_4_,
                CONCAT22(local_120.v_[1]._2_2_,
                         CONCAT11(local_120.v_[1]._1_1_,(undefined1)local_120.v_[1])));
  local_100.v_[1] =
       CONCAT44(uStack_10c,CONCAT22(local_110._2_2_,CONCAT11(local_110._1_1_,(undefined1)local_110))
               );
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((unsigned_long *)(local_100.v_ + 1),5,0xb4,notify);
  local_120.v_[1]._0_1_ = (undefined1)local_f0;
  local_120.v_[1]._1_1_ = (undefined1)((ulong)local_f0 >> 8);
  local_120.v_[1]._2_2_ = (undefined2)((ulong)local_f0 >> 0x10);
  local_120.v_[1]._4_4_ = (undefined4)((ulong)local_f0 >> 0x20);
  local_110._0_1_ = (undefined1)lStack_e8;
  local_110._1_1_ = (undefined1)((ulong)lStack_e8 >> 8);
  local_110._2_2_ = (undefined2)((ulong)lStack_e8 >> 0x10);
  uStack_10c = (undefined4)((ulong)lStack_e8 >> 0x20);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
              ((unsigned_long *)((long)local_120.v_ + lVar1),4,0xbd,notify);
  }
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>(&local_108,5,0xc1,notify);
  return;
}

Assistant:

void VectorTest<Target>::operator()(const HHNotify notify) const {
  HH_TARGET_NAME::TestAll(notify);
}